

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::reparentWidgetWindows
          (QWidgetPrivate *this,QWidget *parentWithWindow,WindowFlags windowFlags)

{
  bool bVar1;
  Int IVar2;
  QWindow *pQVar3;
  QWidget *this_00;
  QWindow *pQVar4;
  QDebug *pQVar5;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWindow *parentWindow;
  QWindow *transientParent;
  QWidget *topLevel;
  QWindow *window;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffeb8;
  WindowType in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec8;
  QWidget *in_stack_fffffffffffffed0;
  QDebug *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  QWidgetPrivate *this_01;
  char *in_stack_ffffffffffffff08;
  QDebug local_e8;
  QDebug local_e0;
  QDebug local_d8 [5];
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90 [5];
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QFlagsStorageHelper<Qt::WindowType,_4> local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar3 = windowHandle(in_RSI,(WindowHandleMode)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  if (pQVar3 == (QWindow *)0x0) {
    reparentWidgetWindowChildren(this_01,(QWidget *)in_RSI);
  }
  else if (in_RSI == (QWidgetPrivate *)0x0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    lcWidgetWindow();
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x37f097);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (char *)0x37f0ad);
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
      QDebug::QDebug(&local_e0,pQVar5);
      ::operator<<((QDebug *)local_d8,(QWindow *)&local_e0);
      QDebug::operator<<(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
      QDebug::~QDebug(local_d8);
      QDebug::~QDebug(&local_e0);
      QDebug::~QDebug(&local_e8);
      local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
    }
    QWindow::setTransientParent(pQVar3);
    QWindow::setParent(pQVar3);
  }
  else {
    local_40.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_RDI,in_stack_fffffffffffffebc);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_40);
    if (IVar2 == 0) {
      pQVar4 = QWidget::windowHandle((QWidget *)in_RDI);
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcWidgetWindow();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x37ef2d);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffed0,(char *)pQVar4,
                   (int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (char *)0x37ef43);
        QMessageLogger::debug();
        pQVar5 = QDebug::operator<<(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
        QDebug::QDebug(&local_a8,pQVar5);
        ::operator<<((QDebug *)&local_a0,(QWindow *)&local_a8);
        pQVar5 = QDebug::operator<<(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
        QDebug::QDebug(&local_98,pQVar5);
        ::operator<<((QDebug *)local_90,(QWindow *)&local_98);
        QDebug::~QDebug(local_90);
        QDebug::~QDebug(&local_98);
        QDebug::~QDebug(&local_a0);
        QDebug::~QDebug(&local_a8);
        QDebug::~QDebug(&local_b0);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      QWindow::setTransientParent(pQVar3);
      QWindow::setParent(pQVar3);
    }
    else {
      this_00 = QWidget::window(in_stack_fffffffffffffed0);
      pQVar4 = QWidget::windowHandle((QWidget *)in_RDI);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      lcWidgetWindow();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x37edae);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)pQVar4,in_stack_fffffffffffffec8,(int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (char *)0x37edc7);
        QMessageLogger::debug();
        pQVar5 = QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff08);
        QDebug::QDebug(&local_60,pQVar5);
        ::operator<<((QDebug *)&local_58,(QWindow *)&local_60);
        pQVar5 = QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff08);
        QDebug::QDebug(&local_50,pQVar5);
        ::operator<<((QDebug *)&local_48,(QWindow *)&local_50);
        QDebug::~QDebug(&local_48);
        QDebug::~QDebug(&local_50);
        QDebug::~QDebug(&local_58);
        QDebug::~QDebug(&local_60);
        QDebug::~QDebug(&local_68);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      QWindow::setTransientParent(pQVar3);
      QWindow::setParent(pQVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::reparentWidgetWindows(QWidget *parentWithWindow, Qt::WindowFlags windowFlags)
{
    if (QWindow *window = windowHandle()) {
        // Reparent this QWindow, and all QWindow children will follow
        if (parentWithWindow) {
            if (windowFlags & Qt::Window) {
                // Top level windows can only have transient parents,
                // and the transient parent must be another top level.
                QWidget *topLevel = parentWithWindow->window();
                auto *transientParent = topLevel->windowHandle();
                Q_ASSERT(transientParent);
                qCDebug(lcWidgetWindow) << "Setting" << window << "transient parent to" << transientParent;
                window->setTransientParent(transientParent);
                window->setParent(nullptr);
            } else {
                auto *parentWindow = parentWithWindow->windowHandle();
                qCDebug(lcWidgetWindow) << "Reparenting" << window << "into" << parentWindow;
                window->setTransientParent(nullptr);
                window->setParent(parentWindow);
            }
        } else {
            qCDebug(lcWidgetWindow) << "Making" << window << "top level window";
            window->setTransientParent(nullptr);
            window->setParent(nullptr);
        }
    } else {
        reparentWidgetWindowChildren(parentWithWindow);
    }
}